

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

ssize_t libssh2_channel_write_ex(LIBSSH2_CHANNEL *channel,int stream_id,char *buf,size_t buflen)

{
  int iVar1;
  time_t start_time;
  time_t entry_time;
  ssize_t rc;
  size_t buflen_local;
  char *buf_local;
  int stream_id_local;
  LIBSSH2_CHANNEL *channel_local;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    channel_local = (LIBSSH2_CHANNEL *)0xffffffffffffffd9;
  }
  else {
    start_time = time((time_t *)0x0);
    do {
      entry_time = _libssh2_channel_write(channel,stream_id,(uchar *)buf,buflen);
      if (((entry_time != -0x25) || (channel->session == (LIBSSH2_SESSION *)0x0)) ||
         (channel->session->api_block_mode == 0)) break;
      iVar1 = _libssh2_wait_socket(channel->session,start_time);
      entry_time = (time_t)iVar1;
    } while (entry_time == 0);
    channel_local = (LIBSSH2_CHANNEL *)entry_time;
  }
  return (ssize_t)channel_local;
}

Assistant:

LIBSSH2_API ssize_t
libssh2_channel_write_ex(LIBSSH2_CHANNEL *channel, int stream_id,
                         const char *buf, size_t buflen)
{
    ssize_t rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 _libssh2_channel_write(channel, stream_id,
                                        (const unsigned char *)buf, buflen));
    return rc;
}